

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void tcmalloc::LLA_SkiplistDelete(AllocList *head,AllocList *e,AllocList **prev)

{
  AllocList *pAVar1;
  bool bVar2;
  int local_2c;
  int i;
  AllocList *found;
  AllocList **prev_local;
  AllocList *e_local;
  AllocList *head_local;
  
  pAVar1 = LLA_SkiplistSearch(head,e,prev);
  if (e == pAVar1) {
    local_2c = 0;
    while( true ) {
      bVar2 = false;
      if (local_2c != e->levels) {
        bVar2 = prev[local_2c]->next[local_2c] == e;
      }
      if (!bVar2) break;
      prev[local_2c]->next[local_2c] = e->next[local_2c];
      local_2c = local_2c + 1;
    }
    while( true ) {
      bVar2 = false;
      if (0 < head->levels) {
        bVar2 = head->next[head->levels + -1] == (AllocList *)0x0;
      }
      if (!bVar2) break;
      head->levels = head->levels + -1;
    }
    return;
  }
  syscall(1,2,"Check failed: e == found: element not in freelist\n",0x32);
  abort();
}

Assistant:

static void LLA_SkiplistDelete(AllocList *head, AllocList *e,
                               AllocList **prev) {
  AllocList *found = LLA_SkiplistSearch(head, e, prev);
  RAW_CHECK(e == found, "element not in freelist");
  for (int i = 0; i != e->levels && prev[i]->next[i] == e; i++) {
    prev[i]->next[i] = e->next[i];
  }
  while (head->levels > 0 && head->next[head->levels - 1] == 0) {
    head->levels--;   // reduce head->levels if level unused
  }
}